

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Promise<void> __thiscall
capnp::anon_unknown_69::WindowFlowController::waitAllAcked(WindowFlowController *this)

{
  SourceLocation location;
  bool bVar1;
  Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t> *t;
  Promise<void> *pPVar2;
  long in_RSI;
  undefined8 in_stack_ffffffffffffff50;
  Maybe<kj::Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>_> local_78;
  SourceLocation local_60;
  undefined1 local_48 [8];
  PromiseFulfillerPair<kj::Promise<void>_> paf;
  Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *q;
  Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *local_20;
  Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *_q4724;
  WindowFlowController *this_local;
  
  this_local = this;
  kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>::
  tryGet<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>>
            ((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>
              *)&q);
  local_20 = kj::_::readMaybe<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>>
                       ((Maybe<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&> *
                        )&q);
  if ((local_20 == (Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)0x0) ||
     (paf.fulfiller.ptr = (PromiseFulfiller<kj::Promise<void>_> *)local_20,
     bVar1 = kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::empty(local_20),
     bVar1)) {
    kj::TaskSet::onEmpty((TaskSet *)this);
  }
  else {
    kj::SourceLocation::SourceLocation
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,"waitAllAcked",0x1276,0x14);
    location.function = (char *)local_60._16_8_;
    location.fileName = local_60.function;
    location.lineNumber = (int)in_stack_ffffffffffffff50;
    location.columnNumber = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    kj::newPromiseAndFulfiller<kj::Promise<void>>(location);
    t = kj::mv<kj::Own<kj::PromiseFulfiller<kj::Promise<void>>,decltype(nullptr)>>
                  ((Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t> *)&paf);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>_>::Maybe
              (&local_78,t);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>_> *)
               (in_RSI + 0x1c0),&local_78);
    kj::Maybe<kj::Own<kj::PromiseFulfiller<kj::Promise<void>_>,_std::nullptr_t>_>::~Maybe(&local_78)
    ;
    pPVar2 = kj::mv<kj::Promise<void>>((Promise<void> *)local_48);
    kj::Promise<void>::Promise((Promise<void> *)this,pPVar2);
    kj::PromiseFulfillerPair<kj::Promise<void>_>::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::Promise<void>_> *)local_48);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> waitAllAcked() override {
    KJ_IF_SOME(q, state.tryGet<Running>()) {
      if (!q.empty()) {
        auto paf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
        emptyFulfiller = kj::mv(paf.fulfiller);
        return kj::mv(paf.promise);
      }
    }
    return tasks.onEmpty();
  }